

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_setup_connection(connectdata *conn)

{
  Curl_easy *data;
  CURLcode CVar1;
  char *in_RAX;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_18;
  
  local_18 = in_RAX;
  pvVar2 = (*Curl_ccalloc)(1,0x20);
  data = conn->data;
  (data->req).protop = pvVar2;
  if (pvVar2 != (void *)0x0) {
    CVar1 = Curl_urldecode(data,(data->state).path,0,&local_18,(size_t *)0x0,true);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if ((*local_18 == '\\') || (pcVar4 = local_18, *local_18 == '/')) {
      pcVar4 = local_18 + 1;
    }
    pcVar4 = (*Curl_cstrdup)(pcVar4);
    *(char **)((long)pvVar2 + 8) = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar3 = strchr(pcVar4,0x2f);
      if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(pcVar4,0x5c), pcVar3 == (char *)0x0)) {
        (*Curl_cfree)(local_18);
        return CURLE_URL_MALFORMAT;
      }
      *pcVar3 = '\0';
      pcVar3 = pcVar3 + 1;
      *(char **)((long)pvVar2 + 0x10) = pcVar3;
      do {
        if (*pcVar3 == '/') {
          *pcVar3 = '\\';
        }
        else if (*pcVar3 == '\0') {
          (*Curl_cfree)(local_18);
          return CURLE_OK;
        }
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
    (*Curl_cfree)(local_18);
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

static CURLcode smb_setup_connection(struct connectdata *conn)
{
  struct smb_request *req;

  /* Initialize the request state */
  conn->data->req.protop = req = calloc(1, sizeof(struct smb_request));
  if(!req)
    return CURLE_OUT_OF_MEMORY;

  /* Parse the URL path */
  return smb_parse_url_path(conn);
}